

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmListFileBacktrace * __thiscall
cmMakefile::GetBacktrace(cmListFileBacktrace *__return_storage_ptr__,cmMakefile *this)

{
  pointer ppcVar1;
  Snapshot snapshot;
  cmListFileBacktrace local_70;
  Snapshot local_30;
  
  cmState::Snapshot::Snapshot(&local_30,(cmState *)0x0);
  local_70.Context.Name._M_dataplus._M_p = (pointer)&local_70.Context.Name.field_2;
  local_70.Context.Name._M_string_length = 0;
  local_70.Context.Name.field_2._M_local_buf[0] = '\0';
  local_70.Context.Line = 0;
  snapshot.Position.Tree = local_30.Position.Tree;
  snapshot.State = local_30.State;
  snapshot.Position.Position = local_30.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace(__return_storage_ptr__,snapshot,&local_70.Context);
  std::__cxx11::string::~string((string *)&local_70);
  ppcVar1 = (this->ContextStack).
            super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((this->ContextStack).
      super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
      _M_impl.super__Vector_impl_data._M_start != ppcVar1) {
    cmListFileBacktrace::cmListFileBacktrace(&local_70,this->StateSnapshot,ppcVar1[-1]);
    cmListFileBacktrace::operator=(__return_storage_ptr__,&local_70);
    cmListFileBacktrace::~cmListFileBacktrace(&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

cmListFileBacktrace cmMakefile::GetBacktrace() const
{
  cmListFileBacktrace backtrace;
  if (!this->ContextStack.empty())
    {
    backtrace = cmListFileBacktrace(this->StateSnapshot,
                                    *this->ContextStack.back());
    }
  return backtrace;
}